

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_parser_t * mpc_real(void)

{
  mpc_parser_t *pmVar1;
  undefined8 *puVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *pmVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  
  pmVar1 = mpc_oneof("+-");
  puVar2 = (undefined8 *)calloc(1,0x38);
  *puVar2 = 0;
  *(undefined2 *)(puVar2 + 6) = 0x13;
  puVar2[1] = pmVar1;
  puVar2[3] = mpcf_ctor_str;
  pmVar1 = mpc_digits();
  pmVar3 = mpc_char('.');
  pmVar4 = mpc_digits();
  pmVar3 = mpc_and(2,mpcf_strfold,pmVar3,pmVar4,free);
  puVar5 = (undefined8 *)calloc(1,0x38);
  *puVar5 = 0;
  *(undefined2 *)(puVar5 + 6) = 0x13;
  puVar5[1] = pmVar3;
  puVar5[3] = mpcf_ctor_str;
  pmVar3 = mpc_oneof("eE");
  pmVar4 = mpc_oneof("+-");
  puVar6 = (undefined8 *)calloc(1,0x38);
  *puVar6 = 0;
  *(undefined2 *)(puVar6 + 6) = 0x13;
  puVar6[1] = pmVar4;
  puVar6[3] = mpcf_ctor_str;
  pmVar4 = mpc_digits();
  pmVar3 = mpc_and(3,mpcf_strfold,pmVar3,puVar6,pmVar4,free,free);
  puVar6 = (undefined8 *)calloc(1,0x38);
  *puVar6 = 0;
  *(undefined2 *)(puVar6 + 6) = 0x13;
  puVar6[1] = pmVar3;
  puVar6[3] = mpcf_ctor_str;
  pmVar1 = mpc_and(4,mpcf_strfold,puVar2,pmVar1,puVar5,puVar6,free,free,free);
  pmVar1 = mpc_expect(pmVar1,"real");
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_real(void) {

  /* [+-]?\d+(\.\d+)?([eE][+-]?[0-9]+)? */

  mpc_parser_t *p0, *p1, *p2, *p30, *p31, *p32, *p3;

  p0 = mpc_maybe_lift(mpc_oneof("+-"), mpcf_ctor_str);
  p1 = mpc_digits();
  p2 = mpc_maybe_lift(mpc_and(2, mpcf_strfold, mpc_char('.'), mpc_digits(), free), mpcf_ctor_str);
  p30 = mpc_oneof("eE");
  p31 = mpc_maybe_lift(mpc_oneof("+-"), mpcf_ctor_str);
  p32 = mpc_digits();
  p3 = mpc_maybe_lift(mpc_and(3, mpcf_strfold, p30, p31, p32, free, free), mpcf_ctor_str);

  return mpc_expect(mpc_and(4, mpcf_strfold, p0, p1, p2, p3, free, free, free), "real");

}